

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

uint32 __thiscall
Js::BufferBuilderOf<short,_true>::FixOffset(BufferBuilderOf<short,_true> *this,uint32 offset)

{
  bool bVar1;
  uint32 offset_local;
  BufferBuilderOf<short,_true> *this_local;
  
  (this->super_BufferBuilder).offset = offset;
  bVar1 = UseOneByte(this);
  if (bVar1) {
    this_local._4_4_ = (this->super_BufferBuilder).offset + 1;
  }
  else {
    bVar1 = UseTwoBytes(this);
    if (bVar1) {
      this_local._4_4_ = (this->super_BufferBuilder).offset + 3;
    }
    else {
      this_local._4_4_ = (this->super_BufferBuilder).offset + 3;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 FixOffset(uint32 offset) override
        {
            this->offset = offset;

            if (useVariableIntEncoding)
            {
                if (UseOneByte())
                {
                    return this->offset + sizeof(serialization_alignment byte);
                }
                else if (UseTwoBytes())
                {
                    return this->offset + sizeof(serialization_alignment uint16) + SENTINEL_BYTE_COUNT;
                }

                return this->offset + sizeof(serialization_alignment T) + SENTINEL_BYTE_COUNT;
            }
            else
            {
                return this->offset + sizeof(serialization_alignment T);
            }
        }